

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

void __thiscall tli_window_manager::Text::print(Text *this,Canvas *canvas,int row,int col)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (ulong)this->index_;
  uVar5 = (this->buffer_)._M_string_length;
  iVar3 = 0;
  iVar2 = 0;
  if (uVar4 < uVar5) {
    iVar2 = 0;
    iVar3 = 0;
    do {
      if ((int)uVar4 == this->cursor_position_) {
        *(undefined1 *)
         (*(long *)&(canvas->
                    super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[iVar3 + row].
                    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
         + (long)(iVar2 + col)) = 0x7c;
        iVar2 = iVar2 + 1;
      }
      cVar1 = (this->buffer_)._M_dataplus._M_p[uVar4];
      if (cVar1 == '\n') {
        iVar3 = iVar3 + 1;
        iVar2 = 0;
        uVar5 = (this->buffer_)._M_string_length;
        if (iVar3 == (this->super_Box).height_) break;
      }
      else {
        *(char *)(*(long *)&(canvas->
                            super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[iVar3 + row].
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data + (long)(iVar2 + col)) = cVar1;
        iVar2 = iVar2 + 1;
        uVar5 = (this->buffer_)._M_string_length;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar5);
  }
  if ((uVar5 == (long)this->cursor_position_) && (iVar3 < (this->super_Box).height_)) {
    *(undefined1 *)
     (*(long *)&(canvas->
                super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[iVar3 + row].
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data +
     (long)(iVar2 + col)) = 0x7c;
  }
  return;
}

Assistant:

void Text::print(Canvas &canvas, int row, int col) const {
    int current_row = 0;
    int current_col = 0;
    for (int i = index_; i < buffer_.size(); ++i) {
        if (i == cursor_position_) {
            canvas[row + current_row][col + current_col] = '|';
            current_col++;
        }

        if (buffer_[i] == '\n') {
            current_row++;
            current_col = 0;
            if (current_row == height_) {
                break;
            }
        } else {
            canvas[row + current_row][col + current_col] = buffer_[i];
            current_col++;
        }
    }
    if (cursor_position_ == buffer_.size() && current_row < height_) {
        canvas[row + current_row][col + current_col] = '|';
    }
}